

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

Number __thiscall LiteScript::Number::operator/(Number *this,Number *number)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *in_RDX;
  float fVar4;
  float fVar5;
  
  if (number->numeric_type == '\0' && *in_RDX == '\0') {
    iVar1 = *(int *)(in_RDX + 4);
    if (iVar1 == 0) {
      fVar4 = nanf("");
      fVar5 = roundf(fVar4);
      bVar3 = fVar5 != fVar4;
      if ((!bVar3) && (!NAN(fVar5) && !NAN(fVar4))) {
        fVar4 = (float)(int)fVar4;
      }
      this->numeric_type = bVar3;
      (this->value).flotting = fVar4;
    }
    else {
      iVar2 = (number->value).integer;
      this->numeric_type = '\0';
      (this->value).integer = iVar2 / iVar1;
    }
  }
  else {
    fVar4 = (number->value).flotting;
    if (number->numeric_type == '\0') {
      fVar4 = (float)(int)fVar4;
    }
    fVar5 = *(float *)(in_RDX + 4);
    if (*in_RDX == '\0') {
      fVar5 = (float)(int)fVar5;
    }
    fVar4 = fVar4 / fVar5;
    fVar5 = roundf(fVar4);
    bVar3 = fVar5 != fVar4;
    if ((!bVar3) && (!NAN(fVar5) && !NAN(fVar4))) {
      fVar4 = (float)(int)fVar4;
    }
    this->numeric_type = bVar3;
    (this->value).flotting = fVar4;
  }
  return (Number)this;
}

Assistant:

LiteScript::Number LiteScript::Number::operator/(const LiteScript::Number& number) const {
    if (this->numeric_type == 0 && number.numeric_type == 0) {
        if (number.value.integer == 0)
            return Number(nanf(""));
        else
            return Number(this->value.integer / number.value.integer);
    }
    else
        return Number((float)*this / (float)number);
}